

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageFieldGenerator::GenerateMessageClearingCode
          (MessageFieldGenerator *this,Printer *printer)

{
  char *text;
  
  text = "GOOGLE_DCHECK($name$_ != NULL);\n$name$_->$type$::Clear();\n";
  if (*(int *)(*(long *)(this->descriptor_ + 0x30) + 0x8c) == 3) {
    text = 
    "if (GetArenaNoVirtual() == NULL && $name$_ != NULL) {\n  delete $name$_;\n}\n$name$_ = NULL;\n"
    ;
  }
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void MessageFieldGenerator::
GenerateMessageClearingCode(io::Printer* printer) const {
  if (!HasFieldPresence(descriptor_->file())) {
    // If we don't have has-bits, message presence is indicated only by ptr !=
    // NULL. Thus on clear, we need to delete the object.
    printer->Print(variables_,
      "if (GetArenaNoVirtual() == NULL && $name$_ != NULL) {\n"
      "  delete $name$_;\n"
      "}\n"
      "$name$_ = NULL;\n");
  } else {
    printer->Print(variables_,
      "GOOGLE_DCHECK($name$_ != NULL);\n"
      "$name$_->$type$::Clear();\n");
  }
}